

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O1

int __thiscall jsoncons::basic_staj_event<char>::get<int>(basic_staj_event<char> *this)

{
  type_conflict4 tVar1;
  undefined4 extraout_EAX;
  ser_error *this_00;
  undefined4 extraout_var;
  error_code ec_00;
  error_code ec;
  undefined1 local_21;
  uint local_20 [2];
  error_category *local_18;
  
  local_20[0] = 0;
  local_18 = (error_category *)std::_V2::system_category();
  tVar1 = get_<int,std::allocator<char>>(this,&local_21,local_20);
  if (local_20[0] == 0) {
    return tVar1;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_20[0];
  ec_00._M_cat = local_18;
  ser_error::ser_error(this_00,ec_00);
  get<int>();
  __cxa_free_exception(this_00);
  _Unwind_Resume(CONCAT44(extraout_var,extraout_EAX));
}

Assistant:

T get() const
    {
        std::error_code ec;
        T val = get<T>(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        return val;
    }